

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

IteratedLogicalExpr __thiscall
ExprTest::MakeIteratedLogical<3>(ExprTest *this,Kind kind,LogicalExpr (*args) [3])

{
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
  BVar1;
  int i;
  long lVar2;
  IteratedLogicalExprBuilder IVar3;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  builder;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  local_30;
  
  IVar3 = mp::BasicExprFactory<std::allocator<char>_>::BeginIteratedLogical(&this->factory_,kind,3);
  local_30.impl_ = IVar3.impl_;
  local_30.arg_index_ = IVar3.arg_index_;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    mp::BasicExprFactory<std::allocator<char>_>::
    BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
    ::AddArg(&local_30,(Arg)(*args)[lVar2].super_ExprBase.impl_);
  }
  builder.arg_index_ = local_30.arg_index_;
  builder.impl_ = local_30.impl_;
  builder._12_4_ = 0;
  BVar1 = mp::BasicExprFactory<std::allocator<char>>::
          EndIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                    ((BasicExprFactory<std::allocator<char>> *)&this->factory_,builder);
  return (IteratedLogicalExpr)
         BVar1.super_BasicExpr<(mp::expr::Kind)66,_(mp::expr::Kind)67>.super_ExprBase.impl_;
}

Assistant:

mp::IteratedLogicalExpr MakeIteratedLogical(
      expr::Kind kind, LogicalExpr (&args)[N]) {
    auto builder = factory_.BeginIteratedLogical(kind, N);
    for (int i = 0; i < N; ++i)
      builder.AddArg(args[i]);
    return factory_.EndIteratedLogical(builder);
  }